

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_2::RgbaYca::decimateChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i;
  float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 local_1c;
  
  for (local_1c = 0; (int)local_1c < in_EDI; local_1c = local_1c + 1) {
    if ((local_1c & 1) == 0) {
      in_stack_ffffffffffffff74 =
           Imath_3_2::half::operator_cast_to_float
                     ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
    }
    *(undefined2 *)(in_RDX + 2 + (long)(int)local_1c * 8) =
         *(undefined2 *)(*(long *)(in_RSI + 0x68) + 2 + (long)(int)local_1c * 8);
    *(undefined2 *)(in_RDX + 6 + (long)(int)local_1c * 8) =
         *(undefined2 *)(*(long *)(in_RSI + 0x68) + 6 + (long)(int)local_1c * 8);
  }
  return;
}

Assistant:

void
decimateChromaVert (int n, const Rgba* const ycaIn[N], Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        if ((i & 1) == 0)
        {
            ycaOut[i].r =
                ycaIn[0][i].r * 0.001064f + ycaIn[2][i].r * -0.003771f +
                ycaIn[4][i].r * 0.009801f + ycaIn[6][i].r * -0.021586f +
                ycaIn[8][i].r * 0.043978f + ycaIn[10][i].r * -0.093067f +
                ycaIn[12][i].r * 0.313659f + ycaIn[13][i].r * 0.499846f +
                ycaIn[14][i].r * 0.313659f + ycaIn[16][i].r * -0.093067f +
                ycaIn[18][i].r * 0.043978f + ycaIn[20][i].r * -0.021586f +
                ycaIn[22][i].r * 0.009801f + ycaIn[24][i].r * -0.003771f +
                ycaIn[26][i].r * 0.001064f;

            ycaOut[i].b =
                ycaIn[0][i].b * 0.001064f + ycaIn[2][i].b * -0.003771f +
                ycaIn[4][i].b * 0.009801f + ycaIn[6][i].b * -0.021586f +
                ycaIn[8][i].b * 0.043978f + ycaIn[10][i].b * -0.093067f +
                ycaIn[12][i].b * 0.313659f + ycaIn[13][i].b * 0.499846f +
                ycaIn[14][i].b * 0.313659f + ycaIn[16][i].b * -0.093067f +
                ycaIn[18][i].b * 0.043978f + ycaIn[20][i].b * -0.021586f +
                ycaIn[22][i].b * 0.009801f + ycaIn[24][i].b * -0.003771f +
                ycaIn[26][i].b * 0.001064f;
        }

        ycaOut[i].g = ycaIn[13][i].g;
        ycaOut[i].a = ycaIn[13][i].a;
    }
}